

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::PointsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,PointsISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  size_t sVar3;
  char *pcVar4;
  PrimRef *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t *psVar16;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  size_t local_58;
  size_t local_50;
  undefined1 auVar18 [64];
  undefined1 auVar20 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar15 = r->_begin;
  auVar19._8_4_ = 0x7f800000;
  auVar19._0_8_ = 0x7f8000007f800000;
  auVar19._12_4_ = 0x7f800000;
  auVar20 = ZEXT1664(auVar19);
  auVar17._8_4_ = 0xff800000;
  auVar17._0_8_ = 0xff800000ff800000;
  auVar17._12_4_ = 0xff800000;
  auVar18 = ZEXT1664(auVar17);
  local_50 = 0;
  auVar21._8_4_ = 0xddccb9a2;
  auVar21._0_8_ = 0xddccb9a2ddccb9a2;
  auVar21._12_4_ = 0xddccb9a2;
  auVar22._8_4_ = 0x5dccb9a2;
  auVar22._0_8_ = 0x5dccb9a25dccb9a2;
  auVar22._12_4_ = 0x5dccb9a2;
  auVar23 = ZEXT1664(auVar17);
  auVar24 = ZEXT1664(auVar19);
  local_58 = k;
  do {
    if (r->_end <= uVar15) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = auVar24._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = auVar23._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar20._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar18._0_16_;
      __return_storage_ptr__->end = local_50;
      return __return_storage_ptr__;
    }
    uVar14 = uVar15 & 0xffffffff;
    pBVar2 = (this->super_Points).vertices.items;
    if (uVar14 < (pBVar2->super_RawBufferView).num) {
      psVar16 = &pBVar2[itime].super_RawBufferView.stride;
      uVar11 = itime - 1;
      do {
        uVar11 = uVar11 + 1;
        if (itime < uVar11) {
          psVar16 = &pBVar2[itime + 1].super_RawBufferView.stride;
          sVar12 = itime;
          goto LAB_01c50573;
        }
        pRVar1 = (RawBufferView *)(psVar16 + -2);
        sVar12 = *psVar16;
        auVar17 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar12 * uVar14);
        uVar9 = vcmpps_avx512vl(auVar17,auVar21,6);
        uVar10 = vcmpps_avx512vl(auVar17,auVar22,1);
      } while (((byte)((byte)uVar9 & (byte)uVar10) == 0xf) &&
              (psVar16 = psVar16 + 7, 0.0 <= *(float *)(pRVar1->ptr_ofs + sVar12 * uVar14 + 0xc)));
    }
LAB_01c50562:
    uVar15 = uVar15 + 1;
  } while( true );
LAB_01c50573:
  sVar12 = sVar12 + 1;
  if (itime + 1 < sVar12) {
    pcVar4 = pBVar2[itime].super_RawBufferView.ptr_ofs;
    lVar13 = pBVar2[itime].super_RawBufferView.stride * uVar15;
    auVar17 = *(undefined1 (*) [16])(pcVar4 + lVar13);
    fVar8 = *(float *)(pcVar4 + lVar13 + 0xc) * (this->super_Points).maxRadiusScale;
    auVar26._4_4_ = fVar8;
    auVar26._0_4_ = fVar8;
    auVar26._8_4_ = fVar8;
    auVar26._12_4_ = fVar8;
    auVar19 = vsubps_avx(auVar17,auVar26);
    aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar19,ZEXT416(geomID),0x30);
    auVar25._0_4_ = auVar17._0_4_ + fVar8;
    auVar25._4_4_ = auVar17._4_4_ + fVar8;
    auVar25._8_4_ = auVar17._8_4_ + fVar8;
    auVar25._12_4_ = auVar17._12_4_ + fVar8;
    aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar25,ZEXT416((uint)uVar15),0x30);
    auVar17 = vminps_avx((undefined1  [16])auVar24._0_16_,(undefined1  [16])aVar6);
    auVar24 = ZEXT1664(auVar17);
    auVar17 = vmaxps_avx((undefined1  [16])auVar23._0_16_,(undefined1  [16])aVar7);
    auVar23 = ZEXT1664(auVar17);
    auVar27._0_4_ = aVar6.x + aVar7.x;
    auVar27._4_4_ = aVar6.y + aVar7.y;
    auVar27._8_4_ = aVar6.z + aVar7.z;
    auVar27._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
    auVar17 = vminps_avx((undefined1  [16])auVar20._0_16_,auVar27);
    auVar20 = ZEXT1664(auVar17);
    auVar17 = vmaxps_avx((undefined1  [16])auVar18._0_16_,auVar27);
    auVar18 = ZEXT1664(auVar17);
    local_50 = local_50 + 1;
    pPVar5 = prims->items;
    pPVar5[local_58].upper.field_0.field_1 = aVar7;
    pPVar5[local_58].lower.field_0.field_1 = aVar6;
    local_58 = local_58 + 1;
    goto LAB_01c50562;
  }
  pRVar1 = (RawBufferView *)(psVar16 + -2);
  sVar3 = *psVar16;
  auVar17 = *(undefined1 (*) [16])(pRVar1->ptr_ofs + sVar3 * uVar14);
  uVar9 = vcmpps_avx512vl(auVar17,auVar21,6);
  uVar10 = vcmpps_avx512vl(auVar17,auVar22,1);
  if (((byte)((byte)uVar9 & (byte)uVar10) != 0xf) ||
     (psVar16 = psVar16 + 7, *(float *)(pRVar1->ptr_ofs + sVar3 * uVar14 + 0xc) < 0.0))
  goto LAB_01c50562;
  goto LAB_01c50573;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, itime, bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }